

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall Map<String,_int>::~Map(Map<String,_int> *this)

{
  String *this_00;
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Data *pDVar3;
  
  pDVar3 = (Data *)&this->_begin;
  while (this_00 = (String *)pDVar3->str, (Item *)this_00 != &this->endItem) {
    String::~String(this_00);
    pDVar3 = &this_00[2]._data;
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }